

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# valid.c
# Opt level: O1

void xmlErrValidNode(xmlValidCtxtPtr ctxt,xmlNodePtr node,xmlParserErrors error,char *msg,
                    xmlChar *str1,xmlChar *str2,xmlChar *str3)

{
  void *ctx;
  void *data;
  xmlGenericErrorFunc channel;
  
  if (ctxt == (xmlValidCtxtPtr)0x0) {
    data = (void *)0x0;
    channel = (xmlGenericErrorFunc)0x0;
    ctx = (void *)0x0;
  }
  else {
    data = ctxt->userData;
    channel = ctxt->error;
    if ((ctxt->finishDtd & 0xfffffffe) == 0xabcd1234) {
      ctx = (void *)0x0;
      if (0xffffffffffffff06 < (ulong)((long)data - (long)ctxt)) {
        ctx = data;
      }
    }
    else {
      ctx = (void *)0x0;
    }
  }
  __xmlRaiseError((xmlStructuredErrorFunc)0x0,channel,data,ctx,node,0x17,error,XML_ERR_ERROR,
                  (char *)0x0,0,(char *)str1,(char *)str2,(char *)str3,0,0,msg,str1,str2,str3);
  return;
}

Assistant:

static void LIBXML_ATTR_FORMAT(4,0)
xmlErrValidNode(xmlValidCtxtPtr ctxt,
                xmlNodePtr node, xmlParserErrors error,
                const char *msg, const xmlChar * str1,
                const xmlChar * str2, const xmlChar * str3)
{
    xmlStructuredErrorFunc schannel = NULL;
    xmlGenericErrorFunc channel = NULL;
    xmlParserCtxtPtr pctxt = NULL;
    void *data = NULL;

    if (ctxt != NULL) {
        channel = ctxt->error;
        data = ctxt->userData;
	/* Use the special values to detect if it is part of a parsing
	   context */
	if ((ctxt->finishDtd == XML_CTXT_FINISH_DTD_0) ||
	    (ctxt->finishDtd == XML_CTXT_FINISH_DTD_1)) {
	    long delta = (char *) ctxt - (char *) ctxt->userData;
	    if ((delta > 0) && (delta < 250))
		pctxt = ctxt->userData;
	}
    }